

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infblock.c
# Opt level: O0

int inflate_blocks(inflate_blocks_statef *s,z_streamp z,int r)

{
  byte bVar1;
  int iVar2;
  voidpf pvVar3;
  ulong uVar4;
  inflate_codes_statef *piVar5;
  undefined4 uVar6;
  uint uVar7;
  uInt uVar8;
  uInt local_f8;
  uInt local_f0;
  uInt local_e8;
  uint local_e4;
  uInt local_e0;
  uInt local_d8;
  uInt local_d0;
  undefined4 local_c4;
  uInt local_b0;
  inflate_codes_statef *c_1;
  inflate_huft *td_1;
  inflate_huft *tl_1;
  uIntf local_88;
  uInt bd_1;
  uInt bl_1;
  uInt c;
  uInt j;
  uInt i;
  inflate_huft *h;
  inflate_huft *td;
  inflate_huft *tl;
  uInt local_58;
  uInt bd;
  uInt bl;
  uInt m;
  Bytef *q;
  byte *pbStack_40;
  uInt n;
  Bytef *p;
  uint uStack_30;
  uInt k;
  uLong b;
  uInt t;
  int r_local;
  z_streamp z_local;
  inflate_blocks_statef *s_local;
  
  pbStack_40 = z->next_in;
  q._4_4_ = z->avail_in;
  _uStack_30 = (char *)s->bitb;
  p._4_4_ = s->bitk;
  _bl = (alloc_func)s->write;
  if (_bl < s->read) {
    local_b0 = ((int)s->read - (int)_bl) - 1;
  }
  else {
    local_b0 = (int)s->end - (int)_bl;
  }
  bd = local_b0;
  b._4_4_ = r;
  _t = z;
  z_local = (z_streamp)s;
  do {
    switch(*(undefined4 *)&z_local->next_in) {
    case 0:
      for (; p._4_4_ < 3; p._4_4_ = p._4_4_ + 8) {
        if (q._4_4_ == 0) {
          z_local->msg = _uStack_30;
          *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
          _t->avail_in = 0;
          _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
          _t->next_in = pbStack_40;
          *(alloc_func *)&z_local->data_type = _bl;
          iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
          return iVar2;
        }
        b._4_4_ = 0;
        q._4_4_ = q._4_4_ - 1;
        _uStack_30 = (char *)((ulong)*pbStack_40 << ((byte)p._4_4_ & 0x3f) | (ulong)_uStack_30);
        pbStack_40 = pbStack_40 + 1;
      }
      b._0_4_ = uStack_30 & 7;
      *(uint *)&z_local->total_out = uStack_30 & 1;
      switch((uint)b >> 1) {
      case 0:
        b._0_4_ = p._4_4_ - 3 & 7;
        _uStack_30 = (char *)(((ulong)_uStack_30 >> 3) >> (sbyte)(uint)b);
        p._4_4_ = (p._4_4_ - 3) - (uint)b;
        *(undefined4 *)&z_local->next_in = 1;
        break;
      case 1:
        inflate_trees_fixed(&local_58,(uIntf *)((long)&tl + 4),&td,&h,_t);
        piVar5 = inflate_codes_new(local_58,tl._4_4_,td,h,_t);
        *(inflate_codes_statef **)&z_local->avail_in = piVar5;
        if (*(long *)&z_local->avail_in == 0) {
          b._4_4_ = 0xfffffffc;
          z_local->msg = _uStack_30;
          *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
          _t->avail_in = q._4_4_;
          _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
          _t->next_in = pbStack_40;
          *(alloc_func *)&z_local->data_type = _bl;
          iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,-4);
          return iVar2;
        }
        _uStack_30 = (char *)((ulong)_uStack_30 >> 3);
        p._4_4_ = p._4_4_ - 3;
        *(undefined4 *)&z_local->next_in = 6;
        break;
      case 2:
        _uStack_30 = (char *)((ulong)_uStack_30 >> 3);
        p._4_4_ = p._4_4_ - 3;
        *(undefined4 *)&z_local->next_in = 3;
        break;
      case 3:
        _uStack_30 = (char *)((ulong)_uStack_30 >> 3);
        p._4_4_ = p._4_4_ - 3;
        *(undefined4 *)&z_local->next_in = 9;
        _t->msg = "invalid block type";
        b._4_4_ = 0xfffffffd;
        z_local->msg = _uStack_30;
        *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
        _t->avail_in = q._4_4_;
        _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
        _t->next_in = pbStack_40;
        *(alloc_func *)&z_local->data_type = _bl;
        iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,-3);
        return iVar2;
      }
      break;
    case 1:
      for (; p._4_4_ < 0x20; p._4_4_ = p._4_4_ + 8) {
        if (q._4_4_ == 0) {
          z_local->msg = _uStack_30;
          *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
          _t->avail_in = 0;
          _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
          _t->next_in = pbStack_40;
          *(alloc_func *)&z_local->data_type = _bl;
          iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
          return iVar2;
        }
        b._4_4_ = 0;
        q._4_4_ = q._4_4_ - 1;
        _uStack_30 = (char *)((ulong)*pbStack_40 << ((byte)p._4_4_ & 0x3f) | (ulong)_uStack_30);
        pbStack_40 = pbStack_40 + 1;
      }
      if ((((ulong)_uStack_30 ^ 0xffffffffffffffff) >> 0x10 & 0xffff) !=
          ((ulong)_uStack_30 & 0xffff)) {
        *(undefined4 *)&z_local->next_in = 9;
        _t->msg = "invalid stored block lengths";
        b._4_4_ = 0xfffffffd;
        z_local->msg = _uStack_30;
        *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
        _t->avail_in = q._4_4_;
        _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
        _t->next_in = pbStack_40;
        *(alloc_func *)&z_local->data_type = _bl;
        iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,-3);
        return iVar2;
      }
      z_local->avail_in = (uint)_uStack_30 & 0xffff;
      p._4_4_ = 0;
      _uStack_30 = (char *)0x0;
      if (z_local->avail_in == 0) {
        local_c4 = 0;
        if ((int)z_local->total_out != 0) {
          local_c4 = 7;
        }
      }
      else {
        local_c4 = 2;
      }
      *(undefined4 *)&z_local->next_in = local_c4;
      break;
    case 2:
      if (q._4_4_ == 0) {
        z_local->msg = _uStack_30;
        *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
        _t->avail_in = 0;
        _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
        _t->next_in = pbStack_40;
        *(alloc_func *)&z_local->data_type = _bl;
        iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
        return iVar2;
      }
      if (bd == 0) {
        if ((_bl == (alloc_func)z_local->zfree) && ((alloc_func)z_local->opaque != z_local->zalloc))
        {
          _bl = z_local->zalloc;
          if (_bl < z_local->opaque) {
            local_d0 = ((int)z_local->opaque - (int)_bl) - 1;
          }
          else {
            local_d0 = (int)z_local->zfree - (int)_bl;
          }
          bd = local_d0;
        }
        if (bd == 0) {
          *(alloc_func *)&z_local->data_type = _bl;
          b._4_4_ = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
          _bl = *(alloc_func *)&z_local->data_type;
          if (_bl < z_local->opaque) {
            local_d8 = ((int)z_local->opaque - (int)_bl) - 1;
          }
          else {
            local_d8 = (int)z_local->zfree - (int)_bl;
          }
          bd = local_d8;
          if ((_bl == (alloc_func)z_local->zfree) &&
             ((alloc_func)z_local->opaque != z_local->zalloc)) {
            _bl = z_local->zalloc;
            if (_bl < z_local->opaque) {
              local_e0 = ((int)z_local->opaque - (int)_bl) - 1;
            }
            else {
              local_e0 = (int)z_local->zfree - (int)_bl;
            }
            bd = local_e0;
          }
          if (bd == 0) {
            z_local->msg = _uStack_30;
            *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
            _t->avail_in = q._4_4_;
            _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
            _t->next_in = pbStack_40;
            *(alloc_func *)&z_local->data_type = _bl;
            iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
            return iVar2;
          }
        }
      }
      b._4_4_ = 0;
      b._0_4_ = z_local->avail_in;
      if (q._4_4_ < (uint)b) {
        b._0_4_ = q._4_4_;
      }
      if (bd < (uint)b) {
        b._0_4_ = bd;
      }
      memcpy(_bl,pbStack_40,(ulong)(uint)b);
      pbStack_40 = pbStack_40 + (uint)b;
      q._4_4_ = q._4_4_ - (uint)b;
      _bl = _bl + (uint)b;
      bd = bd - (uint)b;
      uVar8 = z_local->avail_in - (uint)b;
      z_local->avail_in = uVar8;
      if (uVar8 == 0) {
        uVar6 = 0;
        if ((int)z_local->total_out != 0) {
          uVar6 = 7;
        }
        *(undefined4 *)&z_local->next_in = uVar6;
      }
      break;
    case 3:
      for (; p._4_4_ < 0xe; p._4_4_ = p._4_4_ + 8) {
        if (q._4_4_ == 0) {
          z_local->msg = _uStack_30;
          *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
          _t->avail_in = 0;
          _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
          _t->next_in = pbStack_40;
          *(alloc_func *)&z_local->data_type = _bl;
          iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
          return iVar2;
        }
        b._4_4_ = 0;
        q._4_4_ = q._4_4_ - 1;
        _uStack_30 = (char *)((ulong)*pbStack_40 << ((byte)p._4_4_ & 0x3f) | (ulong)_uStack_30);
        pbStack_40 = pbStack_40 + 1;
      }
      uVar7 = (uint)_uStack_30;
      b._0_4_ = uVar7 & 0x3fff;
      z_local->avail_in = (uint)b;
      if ((0x1d < (uVar7 & 0x1f)) || (0x1d < ((uint)b >> 5 & 0x1f))) {
        *(undefined4 *)&z_local->next_in = 9;
        _t->msg = "too many length or distance symbols";
        b._4_4_ = 0xfffffffd;
        z_local->msg = _uStack_30;
        *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
        _t->avail_in = q._4_4_;
        _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
        _t->next_in = pbStack_40;
        *(alloc_func *)&z_local->data_type = _bl;
        iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,-3);
        return iVar2;
      }
      b._0_4_ = (uVar7 & 0x1f) + 0x102 + ((uint)b >> 5 & 0x1f);
      pvVar3 = (*_t->zalloc)(_t->opaque,(uint)b,4);
      z_local->total_in = (uLong)pvVar3;
      if (pvVar3 == (voidpf)0x0) {
        b._4_4_ = 0xfffffffc;
        z_local->msg = _uStack_30;
        *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
        _t->avail_in = q._4_4_;
        _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
        _t->next_in = pbStack_40;
        *(alloc_func *)&z_local->data_type = _bl;
        iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,-4);
        return iVar2;
      }
      _uStack_30 = (char *)((ulong)_uStack_30 >> 0xe);
      p._4_4_ = p._4_4_ - 0xe;
      *(undefined4 *)&z_local->field_0xc = 0;
      *(undefined4 *)&z_local->next_in = 4;
    case 4:
      while (*(uint *)&z_local->field_0xc < (z_local->avail_in >> 10) + 4) {
        for (; p._4_4_ < 3; p._4_4_ = p._4_4_ + 8) {
          if (q._4_4_ == 0) {
            z_local->msg = _uStack_30;
            *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
            _t->avail_in = 0;
            _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
            _t->next_in = pbStack_40;
            *(alloc_func *)&z_local->data_type = _bl;
            iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
            return iVar2;
          }
          b._4_4_ = 0;
          q._4_4_ = q._4_4_ - 1;
          _uStack_30 = (char *)((ulong)*pbStack_40 << ((byte)p._4_4_ & 0x3f) | (ulong)_uStack_30);
          pbStack_40 = pbStack_40 + 1;
        }
        uVar7 = *(uint *)&z_local->field_0xc;
        *(uint *)&z_local->field_0xc = uVar7 + 1;
        *(uint *)(z_local->total_in + (ulong)border[uVar7] * 4) = (uint)_uStack_30 & 7;
        _uStack_30 = (char *)((ulong)_uStack_30 >> 3);
        p._4_4_ = p._4_4_ - 3;
      }
      while (*(uint *)&z_local->field_0xc < 0x13) {
        uVar7 = *(uint *)&z_local->field_0xc;
        *(uint *)&z_local->field_0xc = uVar7 + 1;
        *(undefined4 *)(z_local->total_in + (ulong)border[uVar7] * 4) = 0;
      }
      *(undefined4 *)&z_local->next_out = 7;
      b._0_4_ = inflate_trees_bits((uIntf *)z_local->total_in,(uIntf *)&z_local->next_out,
                                   (inflate_huft **)&z_local->avail_out,
                                   (inflate_huft *)z_local->state,_t);
      if ((uint)b != 0) {
        b._4_4_ = (uint)b;
        if ((uint)b == -3) {
          (*_t->zfree)(_t->opaque,(voidpf)z_local->total_in);
          *(undefined4 *)&z_local->next_in = 9;
        }
        z_local->msg = _uStack_30;
        *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
        _t->avail_in = q._4_4_;
        _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
        _t->next_in = pbStack_40;
        *(alloc_func *)&z_local->data_type = _bl;
        iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
        return iVar2;
      }
      *(undefined4 *)&z_local->field_0xc = 0;
      *(undefined4 *)&z_local->next_in = 5;
    case 5:
      while (*(uint *)&z_local->field_0xc <
             (z_local->avail_in & 0x1f) + 0x102 + (z_local->avail_in >> 5 & 0x1f)) {
        b._0_4_ = *(uint *)&z_local->next_out;
        for (; p._4_4_ < (uint)b; p._4_4_ = p._4_4_ + 8) {
          if (q._4_4_ == 0) {
            z_local->msg = _uStack_30;
            *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
            _t->avail_in = 0;
            _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
            _t->next_in = pbStack_40;
            *(alloc_func *)&z_local->data_type = _bl;
            iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
            return iVar2;
          }
          b._4_4_ = 0;
          q._4_4_ = q._4_4_ - 1;
          _uStack_30 = (char *)((ulong)*pbStack_40 << ((byte)p._4_4_ & 0x3f) | (ulong)_uStack_30);
          pbStack_40 = pbStack_40 + 1;
        }
        _j = *(long *)&z_local->avail_out + (ulong)((uint)_uStack_30 & inflate_mask[(uint)b]) * 8;
        bVar1 = *(byte *)(_j + 1);
        b._0_4_ = (uint)bVar1;
        bd_1 = *(uint *)(_j + 4);
        if (bd_1 < 0x10) {
          _uStack_30 = (char *)((ulong)_uStack_30 >> (bVar1 & 0x3f));
          p._4_4_ = p._4_4_ - (uint)b;
          uVar7 = *(uint *)&z_local->field_0xc;
          *(uint *)&z_local->field_0xc = uVar7 + 1;
          *(uInt *)(z_local->total_in + (ulong)uVar7 * 4) = bd_1;
        }
        else {
          if (bd_1 == 0x12) {
            local_e4 = 7;
          }
          else {
            local_e4 = bd_1 - 0xe;
          }
          c = local_e4;
          bl_1 = 3;
          if (bd_1 == 0x12) {
            bl_1 = 0xb;
          }
          for (; p._4_4_ < (uint)b + local_e4; p._4_4_ = p._4_4_ + 8) {
            if (q._4_4_ == 0) {
              z_local->msg = _uStack_30;
              *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
              _t->avail_in = 0;
              _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
              _t->next_in = pbStack_40;
              *(alloc_func *)&z_local->data_type = _bl;
              iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
              return iVar2;
            }
            b._4_4_ = 0;
            q._4_4_ = q._4_4_ - 1;
            _uStack_30 = (char *)((ulong)*pbStack_40 << ((byte)p._4_4_ & 0x3f) | (ulong)_uStack_30);
            pbStack_40 = pbStack_40 + 1;
          }
          uVar4 = (ulong)_uStack_30 >> (bVar1 & 0x3f);
          bl_1 = ((uint)uVar4 & inflate_mask[local_e4]) + bl_1;
          _uStack_30 = (char *)(uVar4 >> ((byte)local_e4 & 0x3f));
          p._4_4_ = (p._4_4_ - (uint)b) - local_e4;
          c = *(uInt *)&z_local->field_0xc;
          b._0_4_ = z_local->avail_in;
          if ((((uint)b & 0x1f) + 0x102 + ((uint)b >> 5 & 0x1f) < c + bl_1) ||
             ((bd_1 == 0x10 && (c == 0)))) {
            (*_t->zfree)(_t->opaque,(voidpf)z_local->total_in);
            *(undefined4 *)&z_local->next_in = 9;
            _t->msg = "invalid bit length repeat";
            b._4_4_ = 0xfffffffd;
            z_local->msg = _uStack_30;
            *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
            _t->avail_in = q._4_4_;
            _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
            _t->next_in = pbStack_40;
            *(alloc_func *)&z_local->data_type = _bl;
            iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,-3);
            return iVar2;
          }
          if (bd_1 == 0x10) {
            local_e8 = *(uInt *)(z_local->total_in + (ulong)(c - 1) * 4);
          }
          else {
            local_e8 = 0;
          }
          bd_1 = local_e8;
          do {
            uVar8 = c + 1;
            *(uInt *)(z_local->total_in + (ulong)c * 4) = local_e8;
            bl_1 = bl_1 - 1;
            c = uVar8;
          } while (bl_1 != 0);
          *(uInt *)&z_local->field_0xc = uVar8;
          bl_1 = 0;
        }
      }
      *(undefined8 *)&z_local->avail_out = 0;
      local_88 = 9;
      tl_1._4_4_ = 6;
      b._0_4_ = z_local->avail_in;
      b._0_4_ = inflate_trees_dynamic
                          (((uint)b & 0x1f) + 0x101,((uint)b >> 5 & 0x1f) + 1,
                           (uIntf *)z_local->total_in,&local_88,(uIntf *)((long)&tl_1 + 4),&td_1,
                           (inflate_huft **)&c_1,(inflate_huft *)z_local->state,_t);
      if ((uint)b != 0) {
        if ((uint)b == 0xfffffffd) {
          (*_t->zfree)(_t->opaque,(voidpf)z_local->total_in);
          *(undefined4 *)&z_local->next_in = 9;
        }
        b._4_4_ = (uint)b;
        z_local->msg = _uStack_30;
        *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
        _t->avail_in = q._4_4_;
        _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
        _t->next_in = pbStack_40;
        *(alloc_func *)&z_local->data_type = _bl;
        iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,(uint)b);
        return iVar2;
      }
      piVar5 = inflate_codes_new(local_88,tl_1._4_4_,td_1,(inflate_huft *)c_1,_t);
      if (piVar5 == (inflate_codes_statef *)0x0) {
        b._4_4_ = 0xfffffffc;
        z_local->msg = _uStack_30;
        *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
        _t->avail_in = q._4_4_;
        _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
        _t->next_in = pbStack_40;
        *(alloc_func *)&z_local->data_type = _bl;
        iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,-4);
        return iVar2;
      }
      *(inflate_codes_statef **)&z_local->avail_in = piVar5;
      (*_t->zfree)(_t->opaque,(voidpf)z_local->total_in);
      *(undefined4 *)&z_local->next_in = 6;
    case 6:
      z_local->msg = _uStack_30;
      *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
      _t->avail_in = q._4_4_;
      _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
      _t->next_in = pbStack_40;
      *(alloc_func *)&z_local->data_type = _bl;
      b._4_4_ = inflate_codes((inflate_blocks_statef *)z_local,_t,b._4_4_);
      if (b._4_4_ != 1) {
        iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
        return iVar2;
      }
      b._4_4_ = 0;
      inflate_codes_free(*(inflate_codes_statef **)&z_local->avail_in,_t);
      pbStack_40 = _t->next_in;
      q._4_4_ = _t->avail_in;
      _uStack_30 = z_local->msg;
      p._4_4_ = *(uInt *)((long)&z_local->total_out + 4);
      _bl = *(alloc_func *)&z_local->data_type;
      if (_bl < z_local->opaque) {
        local_f0 = ((int)z_local->opaque - (int)_bl) - 1;
      }
      else {
        local_f0 = (int)z_local->zfree - (int)_bl;
      }
      bd = local_f0;
      if ((int)z_local->total_out != 0) {
        *(undefined4 *)&z_local->next_in = 7;
switchD_00368c53_caseD_7:
        *(alloc_func *)&z_local->data_type = _bl;
        b._4_4_ = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
        _bl = *(alloc_func *)&z_local->data_type;
        if (_bl < z_local->opaque) {
          local_f8 = ((int)z_local->opaque - (int)_bl) - 1;
        }
        else {
          local_f8 = (int)z_local->zfree - (int)_bl;
        }
        bd = local_f8;
        if (z_local->opaque != *(voidpf *)&z_local->data_type) {
          z_local->msg = _uStack_30;
          *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
          _t->avail_in = q._4_4_;
          _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
          _t->next_in = pbStack_40;
          *(alloc_func *)&z_local->data_type = _bl;
          iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,b._4_4_);
          return iVar2;
        }
        *(undefined4 *)&z_local->next_in = 8;
        goto switchD_00368c53_caseD_8;
      }
      *(undefined4 *)&z_local->next_in = 0;
      break;
    case 7:
      goto switchD_00368c53_caseD_7;
    case 8:
switchD_00368c53_caseD_8:
      b._4_4_ = 1;
      z_local->msg = _uStack_30;
      *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
      _t->avail_in = q._4_4_;
      _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
      _t->next_in = pbStack_40;
      *(alloc_func *)&z_local->data_type = _bl;
      iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,1);
      return iVar2;
    case 9:
      b._4_4_ = 0xfffffffd;
      z_local->msg = _uStack_30;
      *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
      _t->avail_in = q._4_4_;
      _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
      _t->next_in = pbStack_40;
      *(alloc_func *)&z_local->data_type = _bl;
      iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,-3);
      return iVar2;
    default:
      b._4_4_ = 0xfffffffe;
      z_local->msg = _uStack_30;
      *(uInt *)((long)&z_local->total_out + 4) = p._4_4_;
      _t->avail_in = q._4_4_;
      _t->total_in = (uLong)(pbStack_40 + (_t->total_in - (long)_t->next_in));
      _t->next_in = pbStack_40;
      *(alloc_func *)&z_local->data_type = _bl;
      iVar2 = inflate_flush((inflate_blocks_statef *)z_local,_t,-2);
      return iVar2;
    }
  } while( true );
}

Assistant:

local int inflate_blocks( /* s, z, r) */
inflate_blocks_statef *s,
z_streamp z,
int r )
{
  uInt t;               /* temporary storage */
  uLong b;              /* bit buffer */
  uInt k;               /* bits in bit buffer */
  Bytef *p;             /* input data pointer */
  uInt n;               /* bytes available there */
  Bytef *q;             /* output window write pointer */
  uInt m;               /* bytes to end of window or read pointer */

  /* copy input/output information to locals (UPDATE macro restores) */
  LOAD

  /* process input based on current state */
  while (1) switch (s->mode)
  {
    case TYPE:
      NEEDBITS(3)
      t = (uInt)b & 7;
      s->last = t & 1;
      switch (t >> 1)
      {
        case 0:                         /* stored */
          Tracev((stderr, "inflate:     stored block%s\n",
                 s->last ? " (last)" : ""));
          DUMPBITS(3)
          t = k & 7;                    /* go to byte boundary */
          DUMPBITS(t)
          s->mode = LENS;               /* get length of stored block */
          break;
        case 1:                         /* fixed */
          Tracev((stderr, "inflate:     fixed codes block%s\n",
                 s->last ? " (last)" : ""));
          {
            uInt bl, bd;
            inflate_huft *tl, *td;

            inflate_trees_fixed(&bl, &bd, (const inflate_huft**)&tl,
                                          (const inflate_huft**)&td, z);
            s->sub.decode.codes = inflate_codes_new(bl, bd, tl, td, z);
            if (s->sub.decode.codes == Z_NULL)
            {
              r = Z_MEM_ERROR;
              LEAVE
            }
          }
          DUMPBITS(3)
          s->mode = CODES;
          break;
        case 2:                         /* dynamic */
          Tracev((stderr, "inflate:     dynamic codes block%s\n",
                 s->last ? " (last)" : ""));
          DUMPBITS(3)
          s->mode = TABLE;
          break;
        case 3:                         /* illegal */
          DUMPBITS(3)
          s->mode = BAD;
          z->msg = (char*)"invalid block type";
          r = Z_DATA_ERROR;
          LEAVE
      }
      break;
    case LENS:
      NEEDBITS(32)
      if ((((~b) >> 16) & 0xffff) != (b & 0xffff))
      {
        s->mode = BAD;
        z->msg = (char*)"invalid stored block lengths";
        r = Z_DATA_ERROR;
        LEAVE
      }
      s->sub.left = (uInt)b & 0xffff;
      b = k = 0;                      /* dump bits */
      Tracev((stderr, "inflate:       stored length %u\n", s->sub.left));
      s->mode = s->sub.left ? STORED : (s->last ? DRY : TYPE);
      break;
    case STORED:
      if (n == 0)
        LEAVE
      NEEDOUT
      t = s->sub.left;
      if (t > n) t = n;
      if (t > m) t = m;
      zmemcpy(q, p, t);
      p += t;  n -= t;
      q += t;  m -= t;
      if ((s->sub.left -= t) != 0)
        break;
      Tracev((stderr, "inflate:       stored end, %lu total out\n",
              z->total_out + (q >= s->read ? q - s->read :
              (s->end - s->read) + (q - s->window))));
      s->mode = s->last ? DRY : TYPE;
      break;
    case TABLE:
      NEEDBITS(14)
      s->sub.trees.table = t = (uInt)b & 0x3fff;
#ifndef PKZIP_BUG_WORKAROUND
      if ((t & 0x1f) > 29 || ((t >> 5) & 0x1f) > 29)
      {
        s->mode = BAD;
        z->msg = (char*)"too many length or distance symbols";
        r = Z_DATA_ERROR;
        LEAVE
      }
#endif
      t = 258 + (t & 0x1f) + ((t >> 5) & 0x1f);
      if ((s->sub.trees.blens = (uIntf*)ZALLOC(z, t, sizeof(uInt))) == Z_NULL)
      {
        r = Z_MEM_ERROR;
        LEAVE
      }
      DUMPBITS(14)
      s->sub.trees.index = 0;
      Tracev((stderr, "inflate:       table sizes ok\n"));
      s->mode = BTREE;
    case BTREE:
      while (s->sub.trees.index < 4 + (s->sub.trees.table >> 10))
      {
        NEEDBITS(3)
        s->sub.trees.blens[border[s->sub.trees.index++]] = (uInt)b & 7;
        DUMPBITS(3)
      }
      while (s->sub.trees.index < 19)
        s->sub.trees.blens[border[s->sub.trees.index++]] = 0;
      s->sub.trees.bb = 7;
      t = inflate_trees_bits(s->sub.trees.blens, &s->sub.trees.bb,
                             &s->sub.trees.tb, s->hufts, z);
      if (t != Z_OK)
      {
        r = t;
        if (r == Z_DATA_ERROR)
        {
          ZFREE(z, s->sub.trees.blens);
          s->mode = BAD;
        }
        LEAVE
      }
      s->sub.trees.index = 0;
      Tracev((stderr, "inflate:       bits tree ok\n"));
      s->mode = DTREE;
    case DTREE:
      while (t = s->sub.trees.table,
             s->sub.trees.index < 258 + (t & 0x1f) + ((t >> 5) & 0x1f))
      {
        inflate_huft *h;
        uInt i, j, c;

        t = s->sub.trees.bb;
        NEEDBITS(t)
        h = s->sub.trees.tb + ((uInt)b & inflate_mask[t]);
        t = h->bits;
        c = h->base;
        if (c < 16)
        {
          DUMPBITS(t)
          s->sub.trees.blens[s->sub.trees.index++] = c;
        }
        else /* c == 16..18 */
        {
          i = c == 18 ? 7 : c - 14;
          j = c == 18 ? 11 : 3;
          NEEDBITS(t + i)
          DUMPBITS(t)
          j += (uInt)b & inflate_mask[i];
          DUMPBITS(i)
          i = s->sub.trees.index;
          t = s->sub.trees.table;
          if (i + j > 258 + (t & 0x1f) + ((t >> 5) & 0x1f) ||
              (c == 16 && i < 1))
          {
            ZFREE(z, s->sub.trees.blens);
            s->mode = BAD;
            z->msg = (char*)"invalid bit length repeat";
            r = Z_DATA_ERROR;
            LEAVE
          }
          c = c == 16 ? s->sub.trees.blens[i - 1] : 0;
          do {
            s->sub.trees.blens[i++] = c;
          } while (--j);
          s->sub.trees.index = i;
        }
      }
      s->sub.trees.tb = Z_NULL;
      {
        uInt bl, bd;
        inflate_huft *tl, *td;
        inflate_codes_statef *c;

        bl = 9;         /* must be <= 9 for lookahead assumptions */
        bd = 6;         /* must be <= 9 for lookahead assumptions */
        t = s->sub.trees.table;
        t = inflate_trees_dynamic(257 + (t & 0x1f), 1 + ((t >> 5) & 0x1f),
                                  s->sub.trees.blens, &bl, &bd, &tl, &td,
                                  s->hufts, z);
        if (t != Z_OK)
        {
          if (t == (uInt)Z_DATA_ERROR)
          {
            ZFREE(z, s->sub.trees.blens);
            s->mode = BAD;
          }
          r = t;
          LEAVE
        }
        Tracev((stderr, "inflate:       trees ok\n"));
        if ((c = inflate_codes_new(bl, bd, tl, td, z)) == Z_NULL)
        {
          r = Z_MEM_ERROR;
          LEAVE
        }
        s->sub.decode.codes = c;
      }
      ZFREE(z, s->sub.trees.blens);
      s->mode = CODES;
    case CODES:
      UPDATE
      if ((r = inflate_codes(s, z, r)) != Z_STREAM_END)
        return inflate_flush(s, z, r);
      r = Z_OK;
      inflate_codes_free(s->sub.decode.codes, z);
      LOAD
      Tracev((stderr, "inflate:       codes end, %lu total out\n",
              z->total_out + (q >= s->read ? q - s->read :
              (s->end - s->read) + (q - s->window))));
      if (!s->last)
      {
        s->mode = TYPE;
        break;
      }
      s->mode = DRY;
    case DRY:
      FLUSH
      if (s->read != s->write)
        LEAVE
      s->mode = DONE;
    case DONE:
      r = Z_STREAM_END;
      LEAVE
    case BAD:
      r = Z_DATA_ERROR;
      LEAVE
    default:
      r = Z_STREAM_ERROR;
      LEAVE
  }
#ifdef NEED_DUMMY_RETURN
  return 0;
#endif
}


local int inflate_blocks_free( /* s, z) */
inflate_blocks_statef *s,
z_streamp z )
{
  inflate_blocks_reset(s, z, Z_NULL);
  ZFREE(z, s->window);
  ZFREE(z, s->hufts);
  ZFREE(z, s);
  Tracev((stderr, "inflate:   blocks freed\n"));
  return Z_OK;
}